

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O3

void __thiscall MDIOAnalyzer::AddArrowMarkers(MDIOAnalyzer *this)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar2 = (this->mMdcPosedgeArrows).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->mMdcPosedgeArrows).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)puVar2[uVar4],(Channel *)0x4);
      puVar2 = (this->mMdcPosedgeArrows).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->mMdcPosedgeArrows).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar1 = uVar5 < (ulong)((long)puVar3 - (long)puVar2 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  if (puVar3 != puVar2) {
    (this->mMdcPosedgeArrows).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (this->mMdcNegedgeArrows).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->mMdcNegedgeArrows).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)puVar2[uVar4],(Channel *)0x5);
      puVar2 = (this->mMdcNegedgeArrows).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->mMdcNegedgeArrows).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar1 = uVar5 < (ulong)((long)puVar3 - (long)puVar2 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  if (puVar3 != puVar2) {
    (this->mMdcNegedgeArrows).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  return;
}

Assistant:

void MDIOAnalyzer::AddArrowMarkers()
{
    // add arrows in clock posedges
    for( U32 i = 0; i < mMdcPosedgeArrows.size(); i++ )
    {
        mResults->AddMarker( mMdcPosedgeArrows[ i ], AnalyzerResults::UpArrow, mSettings->mMdcChannel );
    }
    mMdcPosedgeArrows.clear();

    // add arrows in clock negedges
    for( U32 i = 0; i < mMdcNegedgeArrows.size(); i++ )
    {
        mResults->AddMarker( mMdcNegedgeArrows[ i ], AnalyzerResults::DownArrow, mSettings->mMdcChannel );
    }
    mMdcNegedgeArrows.clear();
}